

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void malloc_conf_init_helper
               (sc_data_t *sc_data,uint *bin_shard_sizes,_Bool initial_call,char **opts_cache,
               char *buf)

{
  byte *pbVar1;
  size_t sVar2;
  _Bool _Var3;
  int iVar4;
  byte *__s2;
  int *piVar5;
  long lVar6;
  percpu_arena_mode_t *ppVar7;
  uintmax_t uVar8;
  byte bVar9;
  byte *pbVar10;
  undefined7 in_register_00000011;
  byte *__s2_00;
  byte *pbVar11;
  ulong uVar12;
  char *pcVar13;
  size_t __n;
  ulong uVar14;
  size_t sVar15;
  char *end;
  size_t vlen_left;
  size_t nshards;
  size_t size_end;
  size_t size_start;
  byte *local_90;
  int *local_88;
  undefined4 local_7c;
  ulong local_78;
  size_t local_70;
  int local_68;
  undefined4 uStack_64;
  size_t local_60;
  size_t local_58;
  char **local_50;
  sc_data_t *local_48;
  uint *local_40;
  char *local_38;
  
  local_7c = (undefined4)CONCAT71(in_register_00000011,initial_call);
  uVar14 = 0;
  local_50 = opts_cache;
  local_48 = sc_data;
  local_40 = bin_shard_sizes;
  local_38 = buf;
  do {
    if ((char)local_7c != '\0') {
      (*(code *)((long)&DAT_0014ea48 + (long)(int)(&DAT_0014ea48)[uVar14 & 0xffffffff]))();
      return;
    }
    __s2_00 = (byte *)local_50[uVar14];
    if (opt_confirm_conf == true) {
      pbVar10 = __s2_00;
      if (__s2_00 == (byte *)0x0) {
        pbVar10 = (byte *)0x14f4af;
      }
      malloc_printf("<jemalloc>: malloc_conf #%u (%s): \"%s\"\n",(ulong)((int)uVar14 + 1),
                    (long)&malloc_conf_init_helper_opts_explain_rel +
                    (long)(int)(&malloc_conf_init_helper_opts_explain_rel)[uVar14],pbVar10);
    }
    if (__s2_00 != (byte *)0x0) {
      bVar9 = *__s2_00;
      if (bVar9 != 0) {
LAB_0013653d:
        pbVar11 = __s2_00 + 2;
        sVar15 = 0;
        pbVar10 = __s2_00 + 1;
        do {
          switch(bVar9) {
          default:
            malloc_write("<jemalloc>: Malformed conf string\n");
            goto LAB_00137819;
          case 0x30:
          case 0x31:
          case 0x32:
          case 0x33:
          case 0x34:
          case 0x35:
          case 0x36:
          case 0x37:
          case 0x38:
          case 0x39:
          case 0x41:
          case 0x42:
          case 0x43:
          case 0x44:
          case 0x45:
          case 0x46:
          case 0x47:
          case 0x48:
          case 0x49:
          case 0x4a:
          case 0x4b:
          case 0x4c:
          case 0x4d:
          case 0x4e:
          case 0x4f:
          case 0x50:
          case 0x51:
          case 0x52:
          case 0x53:
          case 0x54:
          case 0x55:
          case 0x56:
          case 0x57:
          case 0x58:
          case 0x59:
          case 0x5a:
          case 0x5f:
          case 0x61:
          case 0x62:
          case 99:
          case 100:
          case 0x65:
          case 0x66:
          case 0x67:
          case 0x68:
          case 0x69:
          case 0x6a:
          case 0x6b:
          case 0x6c:
          case 0x6d:
          case 0x6e:
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x72:
          case 0x73:
          case 0x74:
          case 0x75:
          case 0x76:
          case 0x77:
          case 0x78:
          case 0x79:
          case 0x7a:
            bVar9 = (__s2_00 + 1)[sVar15];
            sVar15 = sVar15 + 1;
            pbVar11 = pbVar11 + 1;
            pbVar10 = pbVar10 + 1;
            break;
          case 0x3a:
            goto switchD_00136560_caseD_3a;
          }
        } while( true );
      }
LAB_00137819:
      if ((opt_abort_conf == true) && (had_conf_error == '\x01')) {
        malloc_printf("<jemalloc>: Abort (abort_conf:true) on invalid conf value (see above).\n");
        abort();
      }
    }
    uVar14 = uVar14 + 1;
    if (uVar14 == 4) {
      log_init_done.repr = true;
      return;
    }
  } while( true );
switchD_00136560_caseD_3a:
  __s2 = __s2_00 + sVar15 + 1;
  __n = 0;
  for (; pbVar11[-1] != 0; pbVar11 = pbVar11 + 1) {
    if (pbVar11[-1] == 0x2c) {
      if (*pbVar11 == 0) {
        malloc_write("<jemalloc>: Conf string ends with comma\n");
      }
      goto LAB_001365b5;
    }
    __n = __n + 1;
  }
  pbVar11 = pbVar11 + -1;
LAB_001365b5:
  if (sVar15 == 0xc) {
    iVar4 = strncmp("confirm_conf",(char *)__s2_00,0xc);
    if (iVar4 == 0) {
      if (__n == 5) {
        iVar4 = strncmp("false",(char *)__s2,5);
        if (iVar4 == 0) {
          opt_confirm_conf = false;
          goto LAB_00136a5f;
        }
      }
      else if ((__n == 4) && (iVar4 = strncmp("true",(char *)__s2,4), iVar4 == 0)) {
        opt_confirm_conf = true;
LAB_00136a5f:
        if (((char)local_7c != '\0') || (opt_confirm_conf == false)) goto LAB_0013733d;
        uVar12 = 0xc;
        goto LAB_00136b56;
      }
      if ((char)local_7c != '\0') goto LAB_0013733d;
      sVar15 = 0xc;
      pcVar13 = "Invalid conf value";
    }
    else {
      if ((char)local_7c != '\0') goto LAB_0013733d;
LAB_00136624:
      iVar4 = strncmp("metadata_thp",(char *)__s2_00,sVar15);
      if (iVar4 == 0) {
LAB_001367ed:
        lVar6 = 0;
        do {
          iVar4 = strncmp(metadata_thp_mode_names[lVar6],(char *)__s2,__n);
          if (iVar4 == 0) {
            ppVar7 = &opt_metadata_thp;
            goto LAB_00136891;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
LAB_00136876:
        pcVar13 = "Invalid conf value";
      }
      else {
        if (sVar15 == 6) {
          iVar4 = strncmp("retain",(char *)__s2_00,6);
          if (iVar4 == 0) {
            if (__n == 5) {
              iVar4 = strncmp("false",(char *)__s2,5);
              if (iVar4 == 0) {
                opt_retain = false;
                goto LAB_00137181;
              }
            }
            else if ((__n == 4) && (iVar4 = strncmp("true",(char *)__s2,4), iVar4 == 0)) {
              opt_retain = true;
LAB_00137181:
              if (opt_confirm_conf != true) goto LAB_0013733d;
              uVar12 = 6;
              goto LAB_00136b56;
            }
            sVar15 = 6;
            goto LAB_00136e11;
          }
          local_78 = CONCAT44(local_78._4_4_,(int)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1));
        }
        else {
          local_78 = local_78 & 0xffffffff00000000;
        }
        local_88 = (int *)((ulong)local_88 & 0xffffffff00000000);
LAB_001366b3:
        iVar4 = strncmp("dss",(char *)__s2_00,sVar15);
        if (iVar4 == 0) {
          local_88 = (int *)CONCAT44(local_88._4_4_,1);
          lVar6 = 0;
LAB_0013681e:
          iVar4 = strncmp(dss_prec_names[lVar6],(char *)__s2,__n);
          if (iVar4 != 0) goto LAB_0013686d;
          _Var3 = extent_dss_prec_set((dss_prec_t)lVar6);
          if (_Var3) {
            malloc_conf_error("Error setting dss",(char *)__s2_00,sVar15,(char *)__s2,__n);
            local_88 = (int *)((ulong)local_88 & 0xffffffff00000000);
            goto LAB_0013686d;
          }
          opt_dss = dss_prec_names[lVar6];
          bVar9 = (byte)local_88 & opt_confirm_conf;
LAB_00136b39:
          if (bVar9 == 1) {
            uVar12 = sVar15 & 0xffffffff;
            goto LAB_00136b56;
          }
          goto LAB_0013733d;
        }
        if ((sVar15 == 7) && (iVar4 = strncmp("narenas",(char *)__s2_00,7), iVar4 == 0)) {
          piVar5 = __errno_location();
          *piVar5 = 0;
          uVar8 = malloc_strtoumax((char *)__s2,(char **)&local_90,0);
          if ((*piVar5 == 0) && (local_90 + (~(ulong)__s2_00 - __n) == (byte *)0x7)) {
            if (uVar8 != 0) {
              opt_narenas = (uint)uVar8;
              if (opt_confirm_conf != true) goto LAB_0013733d;
              uVar12 = 7;
              goto LAB_00136b56;
            }
            sVar15 = 7;
            goto LAB_001374f2;
          }
          sVar15 = 7;
          goto LAB_00136bef;
        }
        if (((char)local_88 != '\0') &&
           (iVar4 = strncmp("bin_shards",(char *)__s2_00,10), pbVar1 = __s2, sVar2 = __n, iVar4 == 0
           )) {
          do {
            local_70 = sVar2;
            local_90 = pbVar1;
            _Var3 = malloc_conf_multi_sizes_next
                              ((char **)&local_90,&local_70,&local_58,&local_60,(size_t *)&local_68)
            ;
            if ((_Var3) ||
               (_Var3 = bin_update_shard_size
                                  (local_40,local_58,local_60,CONCAT44(uStack_64,local_68)), _Var3))
            {
              pcVar13 = "Invalid settings for bin_shards";
              goto LAB_00137335;
            }
            pbVar1 = local_90;
            sVar2 = local_70;
          } while (local_70 != 0);
          if (opt_confirm_conf != true) goto LAB_0013733d;
          uVar12 = sVar15 & 0xffffffff;
          goto LAB_00136b56;
        }
        if ((long)sVar15 < 0xe) {
          if (sVar15 != 4) {
            if ((sVar15 != 0xb) || (iVar4 = strncmp("stats_print",(char *)__s2_00,0xb), iVar4 != 0))
            goto LAB_00136ca1;
            if (__n == 5) {
              iVar4 = strncmp("false",(char *)__s2,5);
              if (iVar4 == 0) {
                opt_stats_print = false;
                goto LAB_001375bc;
              }
            }
            else if ((__n == 4) && (iVar4 = strncmp("true",(char *)__s2,4), iVar4 == 0)) {
              opt_stats_print = true;
LAB_001375bc:
              if (opt_confirm_conf != true) goto LAB_0013733d;
              uVar12 = 0xb;
              goto LAB_00136b56;
            }
            sVar15 = 0xb;
            goto LAB_00136e11;
          }
          iVar4 = strncmp("junk",(char *)__s2_00,4);
          if (iVar4 != 0) {
            iVar4 = strncmp("zero",(char *)__s2_00,4);
            if (iVar4 != 0) goto LAB_00136ca1;
            if (__n == 5) {
              iVar4 = strncmp("false",(char *)__s2,5);
              if (iVar4 == 0) {
                opt_zero = false;
                goto LAB_001376a9;
              }
            }
            else if ((__n == 4) && (iVar4 = strncmp("true",(char *)__s2,4), iVar4 == 0)) {
              opt_zero = true;
LAB_001376a9:
              if (opt_confirm_conf != true) goto LAB_0013733d;
              uVar12 = 4;
              goto LAB_00136b56;
            }
            sVar15 = 4;
            goto LAB_00136e11;
          }
          if (__n == 5) {
            iVar4 = strncmp("false",(char *)__s2,5);
            if (iVar4 == 0) {
              opt_junk = "false";
              opt_junk_free = false;
              opt_junk_alloc = false;
            }
            else {
              iVar4 = strncmp("alloc",(char *)__s2,5);
              if (iVar4 != 0) goto LAB_00137474;
              opt_junk = "alloc";
              opt_junk_alloc = true;
              opt_junk_free = false;
            }
LAB_00137681:
            if (opt_confirm_conf != true) goto LAB_0013733d;
            uVar12 = 4;
            goto LAB_00136b56;
          }
          if (__n == 4) {
            iVar4 = strncmp("true",(char *)__s2,4);
            if (iVar4 == 0) {
              opt_junk = "true";
              opt_junk_free = true;
              opt_junk_alloc = true;
            }
            else {
              iVar4 = strncmp("free",(char *)__s2,4);
              if (iVar4 != 0) goto LAB_00137474;
              opt_junk = "free";
              opt_junk_alloc = false;
              opt_junk_free = true;
            }
            goto LAB_00137681;
          }
LAB_00137474:
          sVar15 = 4;
LAB_00137479:
          pcVar13 = "Invalid conf value";
        }
        else {
          if (sVar15 != 0x10) {
            if (sVar15 != 0xe) goto LAB_00136ca1;
            iVar4 = strncmp("dirty_decay_ms",(char *)__s2_00,0xe);
            if (iVar4 != 0) {
              iVar4 = strncmp("muzzy_decay_ms",(char *)__s2_00,0xe);
              if (iVar4 == 0) {
                piVar5 = __errno_location();
                *piVar5 = 0;
                lVar6 = strtol((char *)__s2,(char **)&local_90,0);
                if ((*piVar5 != 0) || (local_90 + (~(ulong)__s2_00 - __n) != (byte *)0xe)) {
                  sVar15 = 0xe;
                  goto LAB_00136bef;
                }
                if (lVar6 - 0x10c6f7a0af41U < 0xffffef39085f50be) {
                  sVar15 = 0xe;
                  goto LAB_001374f2;
                }
                opt_muzzy_decay_ms = lVar6;
                if (opt_confirm_conf != true) goto LAB_0013733d;
                uVar12 = 0xe;
                goto LAB_00136b56;
              }
              goto LAB_00136ca1;
            }
            local_88 = __errno_location();
            *local_88 = 0;
            lVar6 = strtol((char *)__s2,(char **)&local_90,0);
            if ((*local_88 == 0) && (local_90 + (~(ulong)__s2_00 - __n) == (byte *)0xe)) {
              if (0xffffef39085f50bd < lVar6 - 0x10c6f7a0af41U) {
                opt_dirty_decay_ms = lVar6;
                if (opt_confirm_conf != true) goto LAB_0013733d;
                uVar12 = 0xe;
                goto LAB_00136b56;
              }
              sVar15 = 0xe;
LAB_001372d8:
              pcVar13 = "Out-of-range conf value";
            }
            else {
              sVar15 = 0xe;
LAB_00137326:
              pcVar13 = "Invalid conf value";
            }
            goto LAB_00137335;
          }
          iVar4 = strncmp("stats_print_opts",(char *)__s2_00,0x10);
          if (iVar4 == 0) {
            if (__n != 0) {
              local_78 = strlen(opt_stats_print_opts);
              sVar15 = __n;
              do {
                bVar9 = *pbVar10;
                if ((bVar9 - 0x4a < 0x2f) &&
                   ((0x400c2d800001U >> ((ulong)(bVar9 - 0x4a) & 0x3f) & 1) != 0)) {
                  local_88 = (int *)CONCAT71(local_88._1_7_,bVar9);
                  pcVar13 = strchr(opt_stats_print_opts,(uint)bVar9);
                  if (pcVar13 == (char *)0x0) {
                    opt_stats_print_opts[local_78] = (char)local_88;
                    opt_stats_print_opts[local_78 + 1] = '\0';
                    local_78 = local_78 + 1;
                  }
                }
                pbVar10 = pbVar10 + 1;
                sVar15 = sVar15 - 1;
              } while (sVar15 != 0);
            }
            if (opt_confirm_conf != true) goto LAB_0013733d;
            uVar12 = 0x10;
            goto LAB_00136b56;
          }
LAB_00136ca1:
          if (((char)local_78 == '\0') || (iVar4 = strncmp("tcache",(char *)__s2_00,6), iVar4 != 0))
          {
            if (sVar15 == 0x18) {
              iVar4 = strncmp("lg_extent_max_active_fit",(char *)__s2_00,0x18);
              if (iVar4 == 0) {
                local_88 = __errno_location();
                *local_88 = 0;
                uVar8 = malloc_strtoumax((char *)__s2,(char **)&local_90,0);
                if ((*local_88 != 0) || (local_90 + (~(ulong)__s2_00 - __n) != (byte *)0x18)) {
                  sVar15 = 0x18;
                  goto LAB_00137326;
                }
                if (0x40 < uVar8) {
                  sVar15 = 0x18;
                  goto LAB_001372d8;
                }
                opt_lg_extent_max_active_fit = uVar8;
                if (opt_confirm_conf != true) goto LAB_0013733d;
                uVar12 = 0x18;
                goto LAB_00136b56;
              }
              iVar4 = strncmp("percpu_arena",(char *)__s2_00,0x18);
              if (iVar4 == 0) goto LAB_00136efd;
              goto LAB_0013712c;
            }
            if (sVar15 != 0x12) {
              if ((sVar15 != 0xd) ||
                 (iVar4 = strncmp("lg_tcache_max",(char *)__s2_00,0xd), iVar4 != 0))
              goto LAB_00136e3a;
              piVar5 = __errno_location();
              *piVar5 = 0;
              lVar6 = strtol((char *)__s2,(char **)&local_90,0);
              if ((*piVar5 == 0) && (local_90 + (~(ulong)__s2_00 - __n) == (byte *)0xd)) {
                if (lVar6 - 0x40U < 0xffffffffffffffbf) {
                  sVar15 = 0xd;
LAB_001374f2:
                  pcVar13 = "Out-of-range conf value";
                  goto LAB_00137335;
                }
                opt_lg_tcache_max = lVar6;
                if (opt_confirm_conf != true) goto LAB_0013733d;
                uVar12 = 0xd;
                goto LAB_00136b56;
              }
              sVar15 = 0xd;
LAB_00136bef:
              pcVar13 = "Invalid conf value";
              goto LAB_00137335;
            }
            iVar4 = strncmp("oversize_threshold",(char *)__s2_00,0x12);
            if (iVar4 == 0) {
              piVar5 = __errno_location();
              *piVar5 = 0;
              uVar8 = malloc_strtoumax((char *)__s2,(char **)&local_90,0);
              if ((*piVar5 != 0) || (local_90 + (~(ulong)__s2_00 - __n) != (byte *)0x12)) {
                sVar15 = 0x12;
                goto LAB_00136bef;
              }
              if (0x7000000000000000 < uVar8) {
                sVar15 = 0x12;
                goto LAB_001374f2;
              }
              opt_oversize_threshold = uVar8;
              if (opt_confirm_conf != true) goto LAB_0013733d;
              uVar12 = 0x12;
              goto LAB_00136b56;
            }
LAB_00136e3a:
            iVar4 = strncmp("percpu_arena",(char *)__s2_00,sVar15);
            if (iVar4 == 0) {
LAB_00136efd:
              lVar6 = 0;
LAB_00136eff:
              iVar4 = strncmp(percpu_arena_mode_names[lVar6],(char *)__s2,__n);
              if (iVar4 != 0) goto code_r0x00136f1f;
              ppVar7 = &opt_percpu_arena;
LAB_00136891:
              *ppVar7 = (metadata_thp_mode_t)lVar6;
              bVar9 = opt_confirm_conf;
              goto LAB_00136b39;
            }
            if (sVar15 == 0x16) {
              iVar4 = strncmp("max_background_threads",(char *)__s2_00,0x16);
              if (iVar4 == 0) {
                piVar5 = __errno_location();
                *piVar5 = 0;
                sVar15 = malloc_strtoumax((char *)__s2,(char **)&local_90,0);
                if ((*piVar5 == 0) && (local_90 + (~(ulong)__s2_00 - __n) == (byte *)0x16)) {
                  if (sVar15 == 0) {
                    sVar15 = 1;
                  }
                  else if (opt_max_background_threads < sVar15) {
                    sVar15 = opt_max_background_threads;
                  }
                  opt_max_background_threads = sVar15;
                  if (opt_confirm_conf != true) goto LAB_0013733d;
                  uVar12 = 0x16;
                  goto LAB_00136b56;
                }
                sVar15 = 0x16;
                goto LAB_00136bef;
              }
            }
            else if ((sVar15 == 0x11) &&
                    (iVar4 = strncmp("background_thread",(char *)__s2_00,0x11), iVar4 == 0)) {
              if (__n == 5) {
                iVar4 = strncmp("false",(char *)__s2,5);
                if (iVar4 == 0) {
                  opt_background_thread = false;
                  goto LAB_0013779b;
                }
              }
              else if ((__n == 4) && (iVar4 = strncmp("true",(char *)__s2,4), iVar4 == 0)) {
                opt_background_thread = true;
LAB_0013779b:
                if (opt_confirm_conf != true) goto LAB_0013733d;
                uVar12 = 0x11;
                goto LAB_00136b56;
              }
              sVar15 = 0x11;
              goto LAB_00136e11;
            }
LAB_0013712c:
            if (((char)local_88 != '\0') &&
               (iVar4 = strncmp("slab_sizes",(char *)__s2_00,10), pbVar10 = __s2, sVar2 = __n,
               iVar4 == 0)) {
              do {
                local_70 = sVar2;
                local_90 = pbVar10;
                _Var3 = malloc_conf_multi_sizes_next
                                  ((char **)&local_90,&local_70,&local_58,&local_60,
                                   (size_t *)&local_68);
                if (_Var3) {
                  pcVar13 = "Invalid settings for slab_sizes";
                  goto LAB_00137335;
                }
                sc_data_update_slab_size(local_48,local_58,local_60,local_68);
                pbVar10 = local_90;
                sVar2 = local_70;
              } while (local_70 != 0);
              if (_Var3 || opt_confirm_conf != true) goto LAB_0013733d;
              uVar12 = sVar15 & 0xffffffff;
              goto LAB_00136b56;
            }
            if (sVar15 == 3) {
              iVar4 = *__s2_00 - 0x74;
              if ((iVar4 == 0) && (iVar4 = __s2_00[1] - 0x68, iVar4 == 0)) {
                iVar4 = 0x70 - (uint)__s2_00[2];
              }
              else {
                iVar4 = -iVar4;
              }
              if (iVar4 == 0) {
                lVar6 = 0;
                do {
                  iVar4 = strncmp(thp_mode_names[lVar6],(char *)__s2,__n);
                  if (iVar4 == 0) {
                    opt_thp = (thp_mode_t)lVar6;
                    if (opt_confirm_conf != true) goto LAB_0013733d;
                    uVar12 = 3;
                    goto LAB_00136b56;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 3);
                sVar15 = 3;
                goto LAB_00137479;
              }
            }
            pcVar13 = "Invalid conf pair";
          }
          else {
            if (__n == 5) {
              iVar4 = strncmp("false",(char *)__s2,5);
              if (iVar4 == 0) {
                opt_tcache = false;
                goto LAB_0013753f;
              }
            }
            else if ((__n == 4) && (iVar4 = strncmp("true",(char *)__s2,4), iVar4 == 0)) {
              opt_tcache = true;
LAB_0013753f:
              if (opt_confirm_conf != true) goto LAB_0013733d;
              uVar12 = sVar15 & 0xffffffff;
LAB_00136b56:
              malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",uVar12,__s2_00,
                            __n & 0xffffffff,__s2);
              goto LAB_0013733d;
            }
            pcVar13 = "Invalid conf value";
          }
        }
      }
    }
  }
  else {
    if ((char)local_7c != '\0') goto LAB_0013733d;
    if (sVar15 == 10) {
      iVar4 = strncmp("abort_conf",(char *)__s2_00,10);
      if (iVar4 != 0) {
        iVar4 = strncmp("metadata_thp",(char *)__s2_00,10);
        if (iVar4 == 0) goto LAB_001367ed;
        local_88 = (int *)CONCAT44(local_88._4_4_,(int)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1))
        ;
        local_78 = local_78 & 0xffffffff00000000;
        goto LAB_001366b3;
      }
      if (__n == 5) {
        iVar4 = strncmp("false",(char *)__s2,5);
        if (iVar4 == 0) {
          opt_abort_conf = false;
          goto LAB_001371f4;
        }
      }
      else if ((__n == 4) && (iVar4 = strncmp("true",(char *)__s2,4), iVar4 == 0)) {
        opt_abort_conf = true;
LAB_001371f4:
        if (opt_confirm_conf != true) goto LAB_0013733d;
        uVar12 = 10;
        goto LAB_00136b56;
      }
      sVar15 = 10;
    }
    else {
      if ((sVar15 != 5) || (iVar4 = strncmp("abort",(char *)__s2_00,5), iVar4 != 0))
      goto LAB_00136624;
      if (__n == 5) {
        iVar4 = strncmp("false",(char *)__s2,5);
        if (iVar4 == 0) {
          opt_abort = false;
          goto LAB_001371c8;
        }
      }
      else if ((__n == 4) && (iVar4 = strncmp("true",(char *)__s2,4), iVar4 == 0)) {
        opt_abort = true;
LAB_001371c8:
        if (opt_confirm_conf != true) goto LAB_0013733d;
        uVar12 = 5;
        goto LAB_00136b56;
      }
      sVar15 = 5;
    }
LAB_00136e11:
    pcVar13 = "Invalid conf value";
  }
LAB_00137335:
  malloc_conf_error(pcVar13,(char *)__s2_00,sVar15,(char *)__s2,__n);
LAB_0013733d:
  bVar9 = *pbVar11;
  __s2_00 = pbVar11;
  if (bVar9 == 0) goto LAB_00137819;
  goto LAB_0013653d;
code_r0x00136f1f:
  lVar6 = lVar6 + 1;
  if (lVar6 == 3) goto LAB_00136876;
  goto LAB_00136eff;
LAB_0013686d:
  lVar6 = lVar6 + 1;
  if (lVar6 == 3) goto LAB_00136876;
  goto LAB_0013681e;
}

Assistant:

static void
malloc_conf_init_helper(sc_data_t *sc_data, unsigned bin_shard_sizes[SC_NBINS],
    bool initial_call, const char *opts_cache[MALLOC_CONF_NSOURCES],
    char buf[PATH_MAX + 1]) {
	static const char *opts_explain[MALLOC_CONF_NSOURCES] = {
		"string specified via --with-malloc-conf",
		"string pointed to by the global variable malloc_conf",
		"\"name\" of the file referenced by the symbolic link named "
		    "/etc/malloc.conf",
		"value of the environment variable MALLOC_CONF"
	};
	unsigned i;
	const char *opts, *k, *v;
	size_t klen, vlen;

	for (i = 0; i < MALLOC_CONF_NSOURCES; i++) {
		/* Get runtime configuration. */
		if (initial_call) {
			opts_cache[i] = obtain_malloc_conf(i, buf);
		}
		opts = opts_cache[i];
		if (!initial_call && opt_confirm_conf) {
			malloc_printf(
			    "<jemalloc>: malloc_conf #%u (%s): \"%s\"\n",
			    i + 1, opts_explain[i], opts != NULL ? opts : "");
		}
		if (opts == NULL) {
			continue;
		}

		while (*opts != '\0' && !malloc_conf_next(&opts, &k, &klen, &v,
		    &vlen)) {

#define CONF_ERROR(msg, k, klen, v, vlen)				\
			if (!initial_call) {				\
				malloc_conf_error(			\
				    msg, k, klen, v, vlen);		\
				cur_opt_valid = false;			\
			}
#define CONF_CONTINUE	{						\
				if (!initial_call && opt_confirm_conf	\
				    && cur_opt_valid) {			\
					malloc_printf("<jemalloc>: Set "\
					    "conf value: %.*s:%.*s\n",	\
					    (int)klen, k, (int)vlen, v);\
				}					\
				continue;				\
			}
#define CONF_MATCH(n)							\
	(sizeof(n)-1 == klen && strncmp(n, k, klen) == 0)
#define CONF_MATCH_VALUE(n)						\
	(sizeof(n)-1 == vlen && strncmp(n, v, vlen) == 0)
#define CONF_HANDLE_BOOL(o, n)						\
			if (CONF_MATCH(n)) {				\
				if (CONF_MATCH_VALUE("true")) {		\
					o = true;			\
				} else if (CONF_MATCH_VALUE("false")) {	\
					o = false;			\
				} else {				\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				}					\
				CONF_CONTINUE;				\
			}
      /*
       * One of the CONF_MIN macros below expands, in one of the use points,
       * to "unsigned integer < 0", which is always false, triggering the
       * GCC -Wtype-limits warning, which we disable here and re-enable below.
       */
      JEMALLOC_DIAGNOSTIC_PUSH
      JEMALLOC_DIAGNOSTIC_IGNORE_TYPE_LIMITS

#define CONF_DONT_CHECK_MIN(um, min)	false
#define CONF_CHECK_MIN(um, min)	((um) < (min))
#define CONF_DONT_CHECK_MAX(um, max)	false
#define CONF_CHECK_MAX(um, max)	((um) > (max))
#define CONF_HANDLE_T_U(t, o, n, min, max, check_min, check_max, clip)	\
			if (CONF_MATCH(n)) {				\
				uintmax_t um;				\
				char *end;				\
									\
				set_errno(0);				\
				um = malloc_strtoumax(v, &end, 0);	\
				if (get_errno() != 0 || (uintptr_t)end -\
				    (uintptr_t)v != vlen) {		\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				} else if (clip) {			\
					if (check_min(um, (t)(min))) {	\
						o = (t)(min);		\
					} else if (			\
					    check_max(um, (t)(max))) {	\
						o = (t)(max);		\
					} else {			\
						o = (t)um;		\
					}				\
				} else {				\
					if (check_min(um, (t)(min)) ||	\
					    check_max(um, (t)(max))) {	\
						CONF_ERROR(		\
						    "Out-of-range "	\
						    "conf value",	\
						    k, klen, v, vlen);	\
					} else {			\
						o = (t)um;		\
					}				\
				}					\
				CONF_CONTINUE;				\
			}
#define CONF_HANDLE_UNSIGNED(o, n, min, max, check_min, check_max,	\
    clip)								\
			CONF_HANDLE_T_U(unsigned, o, n, min, max,	\
			    check_min, check_max, clip)
#define CONF_HANDLE_SIZE_T(o, n, min, max, check_min, check_max, clip)	\
			CONF_HANDLE_T_U(size_t, o, n, min, max,		\
			    check_min, check_max, clip)
#define CONF_HANDLE_SSIZE_T(o, n, min, max)				\
			if (CONF_MATCH(n)) {				\
				long l;					\
				char *end;				\
									\
				set_errno(0);				\
				l = strtol(v, &end, 0);			\
				if (get_errno() != 0 || (uintptr_t)end -\
				    (uintptr_t)v != vlen) {		\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				} else if (l < (ssize_t)(min) || l >	\
				    (ssize_t)(max)) {			\
					CONF_ERROR(			\
					    "Out-of-range conf value",	\
					    k, klen, v, vlen);		\
				} else {				\
					o = l;				\
				}					\
				CONF_CONTINUE;				\
			}
#define CONF_HANDLE_CHAR_P(o, n, d)					\
			if (CONF_MATCH(n)) {				\
				size_t cpylen = (vlen <=		\
				    sizeof(o)-1) ? vlen :		\
				    sizeof(o)-1;			\
				strncpy(o, v, cpylen);			\
				o[cpylen] = '\0';			\
				CONF_CONTINUE;				\
			}

			bool cur_opt_valid = true;

			CONF_HANDLE_BOOL(opt_confirm_conf, "confirm_conf")
			if (initial_call) {
				continue;
			}

			CONF_HANDLE_BOOL(opt_abort, "abort")
			CONF_HANDLE_BOOL(opt_abort_conf, "abort_conf")
			if (strncmp("metadata_thp", k, klen) == 0) {
				int i;
				bool match = false;
				for (i = 0; i < metadata_thp_mode_limit; i++) {
					if (strncmp(metadata_thp_mode_names[i],
					    v, vlen) == 0) {
						opt_metadata_thp = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_BOOL(opt_retain, "retain")
			if (strncmp("dss", k, klen) == 0) {
				int i;
				bool match = false;
				for (i = 0; i < dss_prec_limit; i++) {
					if (strncmp(dss_prec_names[i], v, vlen)
					    == 0) {
						if (extent_dss_prec_set(i)) {
							CONF_ERROR(
							    "Error setting dss",
							    k, klen, v, vlen);
						} else {
							opt_dss =
							    dss_prec_names[i];
							match = true;
							break;
						}
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_UNSIGNED(opt_narenas, "narenas", 1,
			    UINT_MAX, CONF_CHECK_MIN, CONF_DONT_CHECK_MAX,
			    false)
			if (CONF_MATCH("bin_shards")) {
				const char *bin_shards_segment_cur = v;
				size_t vlen_left = vlen;
				do {
					size_t size_start;
					size_t size_end;
					size_t nshards;
					bool err = malloc_conf_multi_sizes_next(
					    &bin_shards_segment_cur, &vlen_left,
					    &size_start, &size_end, &nshards);
					if (err || bin_update_shard_size(
					    bin_shard_sizes, size_start,
					    size_end, nshards)) {
						CONF_ERROR(
						    "Invalid settings for "
						    "bin_shards", k, klen, v,
						    vlen);
						break;
					}
				} while (vlen_left > 0);
				CONF_CONTINUE;
			}
			CONF_HANDLE_SSIZE_T(opt_dirty_decay_ms,
			    "dirty_decay_ms", -1, NSTIME_SEC_MAX * KQU(1000) <
			    QU(SSIZE_MAX) ? NSTIME_SEC_MAX * KQU(1000) :
			    SSIZE_MAX);
			CONF_HANDLE_SSIZE_T(opt_muzzy_decay_ms,
			    "muzzy_decay_ms", -1, NSTIME_SEC_MAX * KQU(1000) <
			    QU(SSIZE_MAX) ? NSTIME_SEC_MAX * KQU(1000) :
			    SSIZE_MAX);
			CONF_HANDLE_BOOL(opt_stats_print, "stats_print")
			if (CONF_MATCH("stats_print_opts")) {
				init_opt_stats_print_opts(v, vlen);
				CONF_CONTINUE;
			}
			if (config_fill) {
				if (CONF_MATCH("junk")) {
					if (CONF_MATCH_VALUE("true")) {
						opt_junk = "true";
						opt_junk_alloc = opt_junk_free =
						    true;
					} else if (CONF_MATCH_VALUE("false")) {
						opt_junk = "false";
						opt_junk_alloc = opt_junk_free =
						    false;
					} else if (CONF_MATCH_VALUE("alloc")) {
						opt_junk = "alloc";
						opt_junk_alloc = true;
						opt_junk_free = false;
					} else if (CONF_MATCH_VALUE("free")) {
						opt_junk = "free";
						opt_junk_alloc = false;
						opt_junk_free = true;
					} else {
						CONF_ERROR(
						    "Invalid conf value",
						    k, klen, v, vlen);
					}
					CONF_CONTINUE;
				}
				CONF_HANDLE_BOOL(opt_zero, "zero")
			}
			if (config_utrace) {
				CONF_HANDLE_BOOL(opt_utrace, "utrace")
			}
			if (config_xmalloc) {
				CONF_HANDLE_BOOL(opt_xmalloc, "xmalloc")
			}
			CONF_HANDLE_BOOL(opt_tcache, "tcache")
			CONF_HANDLE_SSIZE_T(opt_lg_tcache_max, "lg_tcache_max",
			    -1, (sizeof(size_t) << 3) - 1)

			/*
			 * The runtime option of oversize_threshold remains
			 * undocumented.  It may be tweaked in the next major
			 * release (6.0).  The default value 8M is rather
			 * conservative / safe.  Tuning it further down may
			 * improve fragmentation a bit more, but may also cause
			 * contention on the huge arena.
			 */
			CONF_HANDLE_SIZE_T(opt_oversize_threshold,
			    "oversize_threshold", 0, SC_LARGE_MAXCLASS,
			    CONF_DONT_CHECK_MIN, CONF_CHECK_MAX, false)
			CONF_HANDLE_SIZE_T(opt_lg_extent_max_active_fit,
			    "lg_extent_max_active_fit", 0,
			    (sizeof(size_t) << 3), CONF_DONT_CHECK_MIN,
			    CONF_CHECK_MAX, false)

			if (strncmp("percpu_arena", k, klen) == 0) {
				bool match = false;
				for (int i = percpu_arena_mode_names_base; i <
				    percpu_arena_mode_names_limit; i++) {
					if (strncmp(percpu_arena_mode_names[i],
					    v, vlen) == 0) {
						if (!have_percpu_arena) {
							CONF_ERROR(
							    "No getcpu support",
							    k, klen, v, vlen);
						}
						opt_percpu_arena = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_BOOL(opt_background_thread,
			    "background_thread");
			CONF_HANDLE_SIZE_T(opt_max_background_threads,
					   "max_background_threads", 1,
					   opt_max_background_threads,
					   CONF_CHECK_MIN, CONF_CHECK_MAX,
					   true);
			if (CONF_MATCH("slab_sizes")) {
				bool err;
				const char *slab_size_segment_cur = v;
				size_t vlen_left = vlen;
				do {
					size_t slab_start;
					size_t slab_end;
					size_t pgs;
					err = malloc_conf_multi_sizes_next(
					    &slab_size_segment_cur,
					    &vlen_left, &slab_start, &slab_end,
					    &pgs);
					if (!err) {
						sc_data_update_slab_size(
						    sc_data, slab_start,
						    slab_end, (int)pgs);
					} else {
						CONF_ERROR("Invalid settings "
						    "for slab_sizes",
						    k, klen, v, vlen);
					}
				} while (!err && vlen_left > 0);
				CONF_CONTINUE;
			}
			if (config_prof) {
				CONF_HANDLE_BOOL(opt_prof, "prof")
				CONF_HANDLE_CHAR_P(opt_prof_prefix,
				    "prof_prefix", "jeprof")
				CONF_HANDLE_BOOL(opt_prof_active, "prof_active")
				CONF_HANDLE_BOOL(opt_prof_thread_active_init,
				    "prof_thread_active_init")
				CONF_HANDLE_SIZE_T(opt_lg_prof_sample,
				    "lg_prof_sample", 0, (sizeof(uint64_t) << 3)
				    - 1, CONF_DONT_CHECK_MIN, CONF_CHECK_MAX,
				    true)
				CONF_HANDLE_BOOL(opt_prof_accum, "prof_accum")
				CONF_HANDLE_SSIZE_T(opt_lg_prof_interval,
				    "lg_prof_interval", -1,
				    (sizeof(uint64_t) << 3) - 1)
				CONF_HANDLE_BOOL(opt_prof_gdump, "prof_gdump")
				CONF_HANDLE_BOOL(opt_prof_final, "prof_final")
				CONF_HANDLE_BOOL(opt_prof_leak, "prof_leak")
				CONF_HANDLE_BOOL(opt_prof_log, "prof_log")
			}
			if (config_log) {
				if (CONF_MATCH("log")) {
					size_t cpylen = (
					    vlen <= sizeof(log_var_names) ?
					    vlen : sizeof(log_var_names) - 1);
					strncpy(log_var_names, v, cpylen);
					log_var_names[cpylen] = '\0';
					CONF_CONTINUE;
				}
			}
			if (CONF_MATCH("thp")) {
				bool match = false;
				for (int i = 0; i < thp_mode_names_limit; i++) {
					if (strncmp(thp_mode_names[i],v, vlen)
					    == 0) {
						if (!have_madvise_huge) {
							CONF_ERROR(
							    "No THP support",
							    k, klen, v, vlen);
						}
						opt_thp = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_ERROR("Invalid conf pair", k, klen, v, vlen);
#undef CONF_ERROR
#undef CONF_CONTINUE
#undef CONF_MATCH
#undef CONF_MATCH_VALUE
#undef CONF_HANDLE_BOOL
#undef CONF_DONT_CHECK_MIN
#undef CONF_CHECK_MIN
#undef CONF_DONT_CHECK_MAX
#undef CONF_CHECK_MAX
#undef CONF_HANDLE_T_U
#undef CONF_HANDLE_UNSIGNED
#undef CONF_HANDLE_SIZE_T
#undef CONF_HANDLE_SSIZE_T
#undef CONF_HANDLE_CHAR_P
    /* Re-enable diagnostic "-Wtype-limits" */
    JEMALLOC_DIAGNOSTIC_POP
		}
		if (opt_abort_conf && had_conf_error) {
			malloc_abort_invalid_conf();
		}
	}
	atomic_store_b(&log_init_done, true, ATOMIC_RELEASE);
}